

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_getclosurename(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  
  pSVar2 = stack_get(v,idx);
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_CLOSURE) {
    pSVar2 = &((pSVar2->super_SQObject)._unVal.pClosure)->_function->_name;
  }
  else {
    if (SVar1 != OT_NATIVECLOSURE) {
      sq_throwerror(v,"the target is not a closure");
      return -1;
    }
    pSVar2 = &((pSVar2->super_SQObject)._unVal.pNativeClosure)->_name;
  }
  SQVM::Push(v,pSVar2);
  return 0;
}

Assistant:

SQRESULT sq_getclosurename(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(!sq_isnativeclosure(o) &&
        !sq_isclosure(o))
        return sq_throwerror(v,_SC("the target is not a closure"));
    if(sq_isnativeclosure(o))
    {
        v->Push(_nativeclosure(o)->_name);
    }
    else { //closure
        v->Push(_closure(o)->_function->_name);
    }
    return SQ_OK;
}